

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.h
# Opt level: O2

void __thiscall TPZFBMatrix<int>::TPZFBMatrix(TPZFBMatrix<int> *this,TPZFBMatrix<int> *param_1)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0169a920;
  iVar1 = (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow =
       (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fDecomposed =
       (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFBMatrix_01698bb0;
  TPZVec<int>::TPZVec(&this->fElem,&param_1->fElem);
  iVar1 = param_1->fBandUpper;
  this->fBandLower = param_1->fBandLower;
  this->fBandUpper = iVar1;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,&param_1->fPivot);
  return;
}

Assistant:

TPZFBMatrix (const TPZFBMatrix<TVar> & ) = default;